

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O3

void __thiscall MILBlob::Blob::StorageReader::StorageReader(StorageReader *this,string *filename)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  _Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false> _Var4;
  size_type sVar5;
  
  _Var4._M_head_impl = (Impl *)operator_new(0x30);
  pcVar1 = (filename->_M_dataplus)._M_p;
  sVar2 = (filename->field_2)._M_allocated_capacity;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &filename->field_2) {
    sVar5 = filename->_M_string_length;
    lVar3 = *(long *)((long)&filename->field_2 + 8);
    filename->_M_string_length = 0;
    (filename->field_2)._M_local_buf[0] = '\0';
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(_Var4._M_head_impl)->m_filePath =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)&(_Var4._M_head_impl)->m_filePath + 0x10);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(_Var4._M_head_impl)->m_filePath + 0x10))->_M_allocated_capacity = sVar2;
    *(long *)((long)&(_Var4._M_head_impl)->m_filePath + 0x18) = lVar3;
  }
  else {
    sVar5 = filename->_M_string_length;
    (filename->_M_dataplus)._M_p = (pointer)&filename->field_2;
    filename->_M_string_length = 0;
    (filename->field_2)._M_local_buf[0] = '\0';
    *(pointer *)&(_Var4._M_head_impl)->m_filePath = pcVar1;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(_Var4._M_head_impl)->m_filePath + 0x10))->_M_allocated_capacity = sVar2;
  }
  *(size_type *)((long)&(_Var4._M_head_impl)->m_filePath + 8) = sVar5;
  ((_Var4._M_head_impl)->m_loadedFlag)._M_once = 0;
  ((_Var4._M_head_impl)->m_reader)._M_t =
       (__uniq_ptr_data<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>,_true,_true>
        )0x0;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       _Var4._M_head_impl;
  return;
}

Assistant:

StorageReader::StorageReader(std::string filename) : m_impl(std::make_unique<Impl>(std::move(filename))) {}